

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O3

void easm_del_mods(easm_mods *mods)

{
  long lVar1;
  
  if (mods != (easm_mods *)0x0) {
    if (0 < mods->modsnum) {
      lVar1 = 0;
      do {
        easm_del_mod(mods->mods[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < mods->modsnum);
    }
    free(mods->mods);
    free(mods);
    return;
  }
  return;
}

Assistant:

void easm_del_mods(struct easm_mods *mods) {
	if (!mods) return;
	int i;
	for (i = 0; i < mods->modsnum; i++)
		easm_del_mod(mods->mods[i]);
	free(mods->mods);
	free(mods);
}